

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
          (cmFileListGeneratorMacProject *this,cmFileListGeneratorMacProject *r)

{
  cmFileListGeneratorMacProject *r_local;
  cmFileListGeneratorMacProject *this_local;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  cmFileListGeneratorBase::cmFileListGeneratorBase(&this->super_cmFileListGeneratorBase);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorMacProject_00a79c48;
  this->Names = r->Names;
  std::__cxx11::string::string((string *)&this->Extension,(string *)&r->Extension);
  return;
}

Assistant:

cmFileListGeneratorMacProject(cmFileListGeneratorMacProject const& r):
    cmFileListGeneratorBase(), Names(r.Names), Extension(r.Extension) {}